

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_textedit_click(nk_text_edit *state,float x,float y,nk_user_font *font,float row_height)

{
  int iVar1;
  float row_height_local;
  nk_user_font *font_local;
  float y_local;
  float x_local;
  nk_text_edit *state_local;
  
  iVar1 = nk_textedit_locate_coord(state,x,y,font,row_height);
  state->cursor = iVar1;
  state->select_start = state->cursor;
  state->select_end = state->cursor;
  state->has_preferred_x = '\0';
  return;
}

Assistant:

NK_LIB void
nk_textedit_click(struct nk_text_edit *state, float x, float y,
    const struct nk_user_font *font, float row_height)
{
    /* API click: on mouse down, move the cursor to the clicked location,
     * and reset the selection */
    state->cursor = nk_textedit_locate_coord(state, x, y, font, row_height);
    state->select_start = state->cursor;
    state->select_end = state->cursor;
    state->has_preferred_x = 0;
}